

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::getFormatCaseName_abi_cxx11_
          (string *__return_storage_ptr__,pipeline *this,VkFormat format)

{
  char *__s;
  string local_50;
  string fullName;
  
  __s = ::vk::getFormatName((VkFormat)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,__s,(allocator<char> *)&local_50);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&fullName);
  de::toLower(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&fullName);
  return __return_storage_ptr__;
}

Assistant:

std::string getFormatCaseName (VkFormat format)
{
	const std::string fullName = getFormatName(format);

	DE_ASSERT(de::beginsWith(fullName, "VK_FORMAT_"));

	return de::toLower(fullName.substr(10));
}